

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh4asm_test.c
# Opt level: O3

_Bool test_inst(char *inst)

{
  uint16_t auVar1 [1];
  uint uVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t pc;
  char *pcVar6;
  char cVar7;
  
  sVar3 = strlen(inst);
  if (sVar3 == 0) {
    pcVar6 = "empty instruction (this is a proble with the test)";
  }
  else if (inst[sVar3 - 1] == '\n') {
    printf("about to test %s",inst);
    sh4asm_buf_len = 0;
    sh4asm_set_emitter(neo_bin_emit);
    cVar7 = *inst;
    pc = extraout_EDX;
    if (cVar7 != '\0') {
      pp_Var4 = __ctype_tolower_loc();
      pcVar6 = inst + 1;
      do {
        sh4asm_input_char((char)(*pp_Var4)[cVar7]);
        cVar7 = *pcVar6;
        pcVar6 = pcVar6 + 1;
        pc = extraout_EDX_00;
      } while (cVar7 != '\0');
    }
    auVar1[0] = sh4asm_buf[0];
    if (sh4asm_buf_len != 1) {
LAB_00105385:
      printf("invalid sh4asm output length (expected 1, got %u)\n");
      return false;
    }
    sh4asm_disas_len = 0;
    sh4asm_disas_inst(sh4asm_buf[0],(sh4asm_disas_emit_func)(ulong)sh4asm_buf_len,pc);
    uVar2 = sh4asm_disas_len;
    uVar5 = (ulong)sh4asm_disas_len;
    if (uVar5 < 0x80) {
      sh4asm_disas_len = sh4asm_disas_len + 1;
      sh4asm_disas[uVar5] = '\n';
      if (uVar5 != 0x7f) {
        sh4asm_disas_len = uVar2 + 2;
        sh4asm_disas[uVar5 + 1] = '\0';
        printf("The returned instruction was %s");
        sh4asm_buf_len = 0;
        sh4asm_set_emitter(neo_bin_emit);
        if (sh4asm_disas[0] != '\0') {
          pcVar6 = sh4asm_disas;
          cVar7 = sh4asm_disas[0];
          do {
            pcVar6 = pcVar6 + 1;
            sh4asm_input_char(cVar7);
            cVar7 = *pcVar6;
          } while (cVar7 != '\0');
        }
        if (sh4asm_buf_len == 1) {
          if (sh4asm_buf[0] == auVar1[0]) {
            puts("success!");
            return true;
          }
          printf("Error: first assembly returned 0x%04x, second assembly returned 0x%04x\n",
                 (ulong)auVar1[0]);
          return false;
        }
        goto LAB_00105385;
      }
    }
    pcVar6 = "sh4asm disassembler buffer overflow";
  }
  else {
    pcVar6 = "instructions need to end with newlines (this is a problem with the test)";
  }
  errx(1,pcVar6);
}

Assistant:

bool test_inst(char const *inst) {
    size_t len = strlen(inst);

    if (!len)
        errx(1, "empty instruction (this is a proble with the test)");
    if (inst[len - 1] != '\n') {
        errx(1, "instructions need to end with newlines (this is a problem "
             "with the test)");
    }

    printf("about to test %s", inst);

    // first assemble the instruction
    clear_bin();
    sh4asm_set_emitter(neo_bin_emit);
    while (*inst)
        sh4asm_input_char(tolower(*inst++));
    if (sh4asm_buf_len != 1) {
        printf("invalid sh4asm output length (expected 1, got %u)\n",
               sh4asm_buf_len);
        return false;
    }
    uint16_t inst_bin = sh4asm_buf[0];

    // now disassemble it
    clear_asm();
    sh4asm_disas_inst(inst_bin, neo_asm_emit, 0);

    // add in a newline
    neo_asm_emit('\n');
    neo_asm_emit('\0');

    char const *new_inst = sh4asm_disas;

    printf("The returned instruction was %s", new_inst);

    // now reassemble the instruction
    clear_bin();
    sh4asm_set_emitter(neo_bin_emit);
    while (*new_inst)
        sh4asm_input_char(*new_inst++);
    if (sh4asm_buf_len != 1) {
        printf("invalid sh4asm output length (expected 1, got %u)\n",
               sh4asm_buf_len);
        return false;
    }

    if (sh4asm_buf[0] != inst_bin) {
        printf("Error: first assembly returned 0x%04x, second assembly "
               "returned 0x%04x\n",
               (unsigned)inst_bin, (unsigned)sh4asm_buf[0]);
        return false;
    }

    printf("success!\n");

    return true;
}